

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_lcp_2way_unstable_parallel<true>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  lcp_t *lcp_input_00;
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  MergeResult MVar4;
  MergeResult MVar5;
  uchar **ppuVar6;
  lcp_t *lcp_output_00;
  ulong uVar7;
  size_t n_00;
  ulong uVar8;
  uchar **ppuVar9;
  lcp_t lVar10;
  byte bVar11;
  uchar uVar12;
  byte bVar13;
  long lVar14;
  
  if (n < 0x20) {
    if (1 < n) {
      uVar8 = n & 0xffffffff;
      ppuVar6 = strings_input;
      do {
        pbVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar9 = ppuVar6; strings_input < ppuVar9; ppuVar9 = ppuVar9 + -1) {
          pbVar2 = ppuVar9[-1];
          bVar11 = *pbVar2;
          bVar13 = *pbVar1;
          if (bVar11 != 0 && bVar11 == bVar13) {
            lVar14 = 1;
            do {
              bVar11 = pbVar2[lVar14];
              bVar13 = pbVar1[lVar14];
              if (bVar11 == 0) break;
              lVar14 = lVar14 + 1;
            } while (bVar11 == bVar13);
          }
          if (bVar11 <= bVar13) break;
          *ppuVar9 = pbVar2;
        }
        iVar3 = (int)uVar8;
        uVar8 = (ulong)(iVar3 - 1);
        *ppuVar9 = pbVar1;
      } while (2 < iVar3);
    }
    if (n != 1) {
      uVar8 = 0;
      do {
        uVar7 = uVar8 + 1 & 0xffffffff;
        uVar12 = *strings_input[uVar8];
        if (uVar12 == '\0') {
          lVar10 = 0;
        }
        else {
          lVar10 = 0;
          do {
            if (uVar12 != strings_input[uVar7][lVar10]) break;
            uVar12 = strings_input[uVar8][lVar10 + 1];
            lVar10 = lVar10 + 1;
          } while (uVar12 != '\0');
        }
        lcp_input[uVar8] = lVar10;
        uVar8 = uVar8 + 1;
      } while (uVar7 < n - 1);
    }
LAB_001dd0c7:
    MVar4 = SortedInPlace;
  }
  else {
    uVar8 = n >> 1;
    MVar4 = mergesort_lcp_2way_unstable_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,uVar8);
    ppuVar6 = strings_input + uVar8;
    ppuVar9 = strings_output + uVar8;
    lcp_input_00 = lcp_input + uVar8;
    lcp_output_00 = lcp_output + uVar8;
    n_00 = n - uVar8;
    MVar5 = mergesort_lcp_2way_unstable_parallel<true>
                      (ppuVar6,ppuVar9,lcp_input_00,lcp_output_00,n_00);
    if (MVar4 == MVar5) {
      if (MVar4 != SortedInPlace) {
        merge_lcp_2way_unstable<true>
                  (strings_output,lcp_output,uVar8,ppuVar9,lcp_output_00,n_00,strings_input,
                   lcp_input);
        goto LAB_001dd0c7;
      }
    }
    else {
      if (MVar4 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x700,
                      "MergeResult mergesort_lcp_2way_unstable_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = true]"
                     );
      }
      memcpy(ppuVar6,ppuVar9,n_00 * 8);
      memcpy(lcp_input_00,lcp_output_00,n_00 * 8);
    }
    merge_lcp_2way_unstable<true>
              (strings_input,lcp_input,uVar8,ppuVar6,lcp_input_00,n_00,strings_output,lcp_output);
    MVar4 = SortedInTemp;
  }
  return MVar4;
}

Assistant:

MergeResult
mergesort_lcp_2way_unstable_parallel(unsigned char** restrict strings_input,
                            unsigned char** restrict strings_output,
                            lcp_t* restrict lcp_input,
                            lcp_t* restrict lcp_output,
                            size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		for (unsigned i=0; i < n-1; ++i)
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult ml, mr;
#pragma omp task shared(ml)
	ml = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);
#pragma omp task shared(mr)
	mr = mergesort_lcp_2way_unstable_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);
#pragma omp taskwait
	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way_unstable<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}